

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# approximate_quantile.cpp
# Opt level: O2

bool duckdb::ApproxQuantileCoding::Decode<double,unsigned_long>
               (double *source,unsigned_long *target)

{
  bool bVar1;
  
  bVar1 = duckdb::TryCast::Operation<double,unsigned_long>(*source,target,false);
  if (!bVar1) {
    *target = -(ulong)(0.0 < *source || *source == 0.0);
  }
  return bVar1;
}

Assistant:

static bool Decode(const SAVE_TYPE &source, TARGET_TYPE &target) {
		// The result is approximate, so clamp instead of overflowing.
		if (TryCast::Operation(source, target, false)) {
			return true;
		} else if (source < 0) {
			target = NumericLimits<TARGET_TYPE>::Minimum();
		} else {
			target = NumericLimits<TARGET_TYPE>::Maximum();
		}
		return false;
	}